

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_manyvector.c
# Opt level: O1

SUNErrCode N_VBufPack_ManyVector(N_Vector x,void *buf)

{
  long in_RAX;
  long *plVar1;
  void *pvVar2;
  long lVar3;
  sunindextype offset;
  long local_28;
  
  plVar1 = (long *)x->content;
  if (0 < *plVar1) {
    lVar3 = 0;
    pvVar2 = buf;
    local_28 = in_RAX;
    do {
      N_VBufPack(*(undefined8 *)(plVar1[2] + lVar3 * 8),pvVar2);
      N_VBufSize(*(undefined8 *)(*(long *)((long)x->content + 0x10) + lVar3 * 8),&local_28);
      pvVar2 = (void *)(local_28 + (long)buf);
      lVar3 = lVar3 + 1;
      plVar1 = (long *)x->content;
    } while (lVar3 < *plVar1);
  }
  return 0;
}

Assistant:

SUNErrCode MVAPPEND(N_VBufPack)(N_Vector x, void* buf)
{
  SUNFunctionBegin(x->sunctx);
  void* loc;           /* location in output buffer */
  sunindextype offset; /* subvector buffer offset   */
  sunindextype i;

  SUNAssert(buf, SUN_ERR_ARG_CORRUPT);

  /* start at the beginning of the output buffer */
  loc = buf;

  for (i = 0; i < MANYVECTOR_NUM_SUBVECS(x); i++)
  {
    /* pack the output buffer starting at the given buffer location */
    SUNCheckCall(N_VBufPack(MANYVECTOR_SUBVEC(x, i), loc));

    /* get the offset from this subvector */
    SUNCheckCall(N_VBufSize(MANYVECTOR_SUBVEC(x, i), &offset));

    /* update the buffer location for the next vector */
    loc = (char*)buf + offset;
  }

  return SUN_SUCCESS;
}